

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O0

void test_find_cb(CuTest *tc)

{
  CuTest *pCVar1;
  _Bool _Var2;
  int local_34;
  selist *psStack_30;
  int i;
  selist *il;
  selist *ql;
  undefined4 local_18;
  int c;
  int b;
  int a;
  CuTest *tc_local;
  
  c = 0x2a;
  local_18 = 0x17;
  ql._4_4_ = 0x2a;
  il = (selist *)0x0;
  _b = tc;
  selist_push(&il,&c);
  selist_push(&il,&local_18);
  selist_push(&il,(void *)((long)&ql + 4));
  pCVar1 = _b;
  psStack_30 = il;
  local_34 = 0;
  _Var2 = selist_find(&stack0xffffffffffffffd0,&local_34,&c,cb_match_int);
  CuAssert_Line(pCVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x4c,"assert failed",(uint)_Var2);
  CuAssertIntEquals_LineMsg
            (_b,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x4d,(char *)0x0,0,local_34);
  selist_advance(&stack0xffffffffffffffd0,&local_34,1);
  pCVar1 = _b;
  _Var2 = selist_find(&stack0xffffffffffffffd0,&local_34,&c,cb_match_int);
  CuAssert_Line(pCVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x50,"assert failed",(uint)_Var2);
  CuAssertIntEquals_LineMsg
            (_b,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x51,(char *)0x0,2,local_34);
  selist_advance(&stack0xffffffffffffffd0,&local_34,1);
  pCVar1 = _b;
  _Var2 = selist_find(&stack0xffffffffffffffd0,&local_34,&c,cb_match_int);
  CuAssert_Line(pCVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x54,"assert failed",(uint)((_Var2 ^ 0xffU) & 1));
  selist_free(il);
  return;
}

Assistant:

static void test_find_cb(CuTest *tc) {
    int a = 42;
    int b = 23;
    int c = 42;
    struct selist *ql = NULL;
    struct selist *il;
    int i;

    selist_push(&ql, (void *)&a);
    selist_push(&ql, (void *)&b);
    selist_push(&ql, (void *)&c);

    il = ql; i = 0;
    CuAssertTrue(tc, selist_find(&il, &i, (void *)&a, cb_match_int));
    CuAssertIntEquals(tc, 0, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, selist_find(&il, &i, (void *)&a, cb_match_int));
    CuAssertIntEquals(tc, 2, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, !selist_find(&il, &i, (void *)&a, cb_match_int));
    selist_free(ql);
}